

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalWatcomWMakeGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalWatcomWMakeGenerator::SetSystemName
          (cmGlobalWatcomWMakeGenerator *this,string *s,cmMakefile *mf)

{
  bool bVar1;
  string *__lhs;
  string_view value;
  string_view value_00;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_SYSTEM_PROCESSOR",&local_31);
  __lhs = cmMakefile::GetSafeDefinition(mf,&local_30);
  bVar1 = std::operator==(__lhs,"I86");
  std::__cxx11::string::~string((string *)&local_30);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"CMAKE_GENERATOR_CC",&local_31);
    value._M_str = "wcl";
    value._M_len = 3;
    cmMakefile::AddDefinition(mf,&local_30,value);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"CMAKE_GENERATOR_CXX",&local_31);
    value_00._M_str = "wcl";
    value_00._M_len = 3;
    cmMakefile::AddDefinition(mf,&local_30,value_00);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return true;
}

Assistant:

bool cmGlobalWatcomWMakeGenerator::SetSystemName(std::string const& s,
                                                 cmMakefile* mf)
{
  if (mf->GetSafeDefinition("CMAKE_SYSTEM_PROCESSOR") == "I86") {
    mf->AddDefinition("CMAKE_GENERATOR_CC", "wcl");
    mf->AddDefinition("CMAKE_GENERATOR_CXX", "wcl");
  }
  return this->cmGlobalUnixMakefileGenerator3::SetSystemName(s, mf);
}